

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

int Assimp_CompareDump(char **params,uint num)

{
  int iVar1;
  uint32_t uVar2;
  ostream *poVar3;
  FILE *pFVar4;
  FILE *pFVar5;
  FILE *expect;
  void *this;
  compare_fails_exception *ex;
  comparer_context comp;
  file_ptr expected;
  file_ptr local_28;
  file_ptr actual;
  uint num_local;
  char **params_local;
  
  actual.m_file._4_4_ = num;
  if ((((num == 1) && (iVar1 = strcmp(*params,"-h"), iVar1 == 0)) ||
      (iVar1 = strcmp(*params,"--help"), iVar1 == 0)) || (iVar1 = strcmp(*params,"-?"), iVar1 == 0))
  {
    printf("%s",AICMD_MSG_CMPDUMP_HELP);
    return 0;
  }
  if (actual.m_file._4_4_ < 2) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "assimp cmpdump: Invalid number of arguments. See \'assimp cmpdump --help\'\r\n"
                            );
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    return 1;
  }
  iVar1 = strcmp(*params,params[1]);
  if (iVar1 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"assimp cmpdump: same file, same content.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    return 0;
  }
  pFVar4 = fopen(*params,"rb");
  Assimp_CompareDump::file_ptr::file_ptr(&local_28,(FILE *)pFVar4);
  pFVar5 = Assimp_CompareDump(char_const*const*,unsigned_int)::file_ptr::operator_cast_to__IO_FILE_
                     ((file_ptr *)&local_28);
  if (pFVar5 == (FILE *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "assimp cmpdump: Failure reading ACTUAL data from ");
    poVar3 = std::operator<<(poVar3,*params);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    params_local._4_4_ = -5;
  }
  else {
    pFVar4 = fopen(params[1],"rb");
    Assimp_CompareDump::file_ptr::file_ptr((file_ptr *)&comp.cnt_chunks,(FILE *)pFVar4);
    pFVar5 = Assimp_CompareDump(char_const*const*,unsigned_int)::file_ptr::
             operator_cast_to__IO_FILE_((file_ptr *)&comp.cnt_chunks);
    if (pFVar5 == (FILE *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "assimp cmpdump: Failure reading EXPECT data from ");
      poVar3 = std::operator<<(poVar3,params[1]);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      params_local._4_4_ = -6;
    }
    else {
      pFVar5 = Assimp_CompareDump(char_const*const*,unsigned_int)::file_ptr::
               operator_cast_to__IO_FILE_((file_ptr *)&local_28);
      expect = Assimp_CompareDump(char_const*const*,unsigned_int)::file_ptr::
               operator_cast_to__IO_FILE_((file_ptr *)&comp.cnt_chunks);
      comparer_context::comparer_context((comparer_context *)&ex,pFVar5,expect);
      CheckHeader((comparer_context *)&ex);
      CompareOnTheFly((comparer_context *)&ex);
      poVar3 = std::operator<<((ostream *)&std::cout,"Success (totally ");
      this = (void *)std::ostream::operator<<(poVar3,std::dec);
      uVar2 = comparer_context::get_num_chunks((comparer_context *)&ex);
      poVar3 = (ostream *)std::ostream::operator<<(this,uVar2);
      poVar3 = std::operator<<(poVar3," chunks)");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      params_local._4_4_ = 0;
      comparer_context::~comparer_context((comparer_context *)&ex);
    }
    Assimp_CompareDump::file_ptr::~file_ptr((file_ptr *)&comp.cnt_chunks);
  }
  Assimp_CompareDump::file_ptr::~file_ptr(&local_28);
  return params_local._4_4_;
}

Assistant:

int Assimp_CompareDump (const char* const* params, unsigned int num)
{
    // --help
    if ((num == 1 && !strcmp( params[0], "-h")) || !strcmp( params[0], "--help") || !strcmp( params[0], "-?") ) {
        printf("%s",AICMD_MSG_CMPDUMP_HELP);
        return 0;
    }

    // assimp cmpdump actual expected
    if (num < 2) {
        std::cout << "assimp cmpdump: Invalid number of arguments. "
            "See \'assimp cmpdump --help\'\r\n" << std::endl;
        return 1;
    }

    if(!strcmp(params[0],params[1])) {
        std::cout << "assimp cmpdump: same file, same content." << std::endl;
        return 0;
    }

    class file_ptr
    {
    public:
        file_ptr(FILE *p)
            : m_file(p)
        {}
        ~file_ptr()
        {
            if (m_file)
            {
                fclose(m_file);
                m_file = NULL;
            }
        }

        operator FILE *() { return m_file; }

    private:
        FILE *m_file;
    };
    file_ptr actual(fopen(params[0],"rb"));
    if (!actual) {
        std::cout << "assimp cmpdump: Failure reading ACTUAL data from " <<
            params[0]  << std::endl;
        return -5;
    }
    file_ptr expected(fopen(params[1],"rb"));
    if (!expected) {
        std::cout << "assimp cmpdump: Failure reading EXPECT data from " <<
            params[1]  << std::endl;
        return -6;
    }

    comparer_context comp(actual,expected);
    try {
        CheckHeader(comp);
        CompareOnTheFly(comp);
    }
    catch(const compare_fails_exception& ex) {
        printf("%s",ex.what());
        return -1;
    }
    catch(...) {
        // we don't bother checking too rigourously here, so
        // we might end up here ...
        std::cout << "Unknown failure, are the input files well-defined?";
        return -3;
    }

    std::cout << "Success (totally " << std::dec << comp.get_num_chunks() <<
        " chunks)" << std::endl;

    return 0;
}